

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_gc_mark_protected_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_gc_mark_protected *t)

{
  TD_mtbdd_gc_mark_protected *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  mtbdd_gc_mark_protected_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&mtbdd_protected, 0, mtbdd_protected.refs_size);
    while (it != NULL) {
        BDD *to_mark = (BDD*)protect_next(&mtbdd_protected, &it, mtbdd_protected.refs_size);
        SPAWN(mtbdd_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}